

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockableVector.hpp
# Opt level: O2

shared_ptr<LockedVector<int>_> __thiscall
LockableVector<int>::tryLockAndGet(LockableVector<int> *this)

{
  bool bVar1;
  LockedVector<int> *__p;
  logic_error *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  LockableVector<int> *in_RSI;
  shared_ptr<LockedVector<int>_> sVar2;
  
  bVar1 = std::mutex::try_lock(&in_RSI->vectorMutex);
  if (bVar1) {
    __p = (LockedVector<int> *)operator_new(0x10);
    __p->parent = in_RSI;
    __p->data = &in_RSI->dataVector;
    std::__shared_ptr<LockedVector<int>,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<LockedVector<int>,void>
              ((__shared_ptr<LockedVector<int>,(__gnu_cxx::_Lock_policy)2> *)this,__p);
    sVar2.super___shared_ptr<LockedVector<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar2.super___shared_ptr<LockedVector<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<LockedVector<int>_>)
           sVar2.super___shared_ptr<LockedVector<int>,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (logic_error *)__cxa_allocate_exception();
  std::logic_error::logic_error(this_00,"No lock acquired");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

std::shared_ptr<LockedVector<T>> tryLockAndGet () {
		if (vectorMutex.try_lock ()) {
			return std::shared_ptr<LockedVector<T>> (new LockedVector<T> (dataVector, this));
		}
		throw std::logic_error ("No lock acquired");
	}